

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O1

int anon_unknown.dwarf_26359::ChannelOut_nrpn(lua_State *L)

{
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  char local_2c [3];
  char local_29 [3];
  char local_26 [3];
  char local_23 [3];
  
  plVar1 = (long *)luaL_checkudata(L,1,"luartmidi.channelout");
  uVar2 = luaL_checkinteger(L,2);
  uVar3 = luaL_checkinteger(L,3);
  if (0x3fff < uVar2) {
    luaL_argerror(L,2,"Parameter number must be between 0 and 16383");
  }
  if (0x3fff < uVar3) {
    luaL_argerror(L,3,"Parameter value must be between 0 and 16383");
  }
  local_2c[0] = (char)plVar1[1] + -0x50;
  local_2c[1] = 0x62;
  local_2c[2] = (byte)uVar2 & 0x7f;
  (**(code **)(**(long **)(*plVar1 + 8) + 0x58))(*(long **)(*plVar1 + 8),local_2c,3);
  local_29[0] = (char)plVar1[1] + -0x50;
  local_29[1] = 99;
  local_29[2] = (byte)((uint)uVar2 >> 7) & 0x7f;
  (**(code **)(**(long **)(*plVar1 + 8) + 0x58))(*(long **)(*plVar1 + 8),local_29,3);
  local_26[0] = (char)plVar1[1] + -0x50;
  local_26[1] = 6;
  local_26[2] = (byte)(uVar3 >> 7) & 0x7f;
  (**(code **)(**(long **)(*plVar1 + 8) + 0x58))(*(long **)(*plVar1 + 8),local_26,3);
  local_23[0] = (char)plVar1[1] + -0x50;
  local_23[1] = 0x26;
  local_23[2] = (byte)uVar3 & 0x7f;
  (**(code **)(**(long **)(*plVar1 + 8) + 0x58))(*(long **)(*plVar1 + 8),local_23,3);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_nrpn(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer number = luaL_checkinteger(L, 2);
	lua_Integer value = luaL_checkinteger(L, 3);

	luaL_argcheck(L, number >= 0 && number <= 0x3FFF, 2, "Parameter number must be between 0 and 16383");
	luaL_argcheck(L, value >= 0 && value <= 0x3FFF, 3, "Parameter value must be between 0 and 16383");

	self.send(0xB0 + self.index, 0x62, number & 0x7Fu);
	self.send(0xB0 + self.index, 0x63, (number >> 7) & 0x7Fu);
	self.send(0xB0 + self.index, 0x06, (value >> 7) & 0x7Fu);
	self.send(0xB0 + self.index, 0x26, value & 0x7Fu);
	lua_settop(L, 1);
	return 1;
}